

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

void leb_DecodeNodeAttributeArray(leb_Node node,int attributeArraySize,float (*attributeArray) [3])

{
  float (*extraout_RDX) [3];
  float (*y) [3];
  float *y_00;
  float *y_01;
  float (*extraout_RDX_00) [3];
  uint uVar1;
  ulong uVar2;
  long lVar3;
  float fVar4;
  float attributeVector [3];
  undefined8 local_68;
  undefined4 local_60;
  float local_58 [3];
  undefined1 auStack_4c [4];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if (0 < attributeArraySize) {
    local_58[0] = 1.0;
    local_58[1] = 0.0;
    stack0xffffffffffffffb0 = 0;
    local_48 = 0x3f800000;
    uStack_40 = 0;
    local_38 = 0x3f800000;
    uVar2 = (ulong)node >> 0x20;
    y = attributeArray;
    while (0 < (int)uVar2) {
      uVar1 = (int)uVar2 - 1;
      leb__SplittingMatrix(&local_58,(uint)((node.id >> (uVar1 & 0x1f) & 1) != 0));
      y = extraout_RDX;
      uVar2 = (ulong)uVar1;
    }
    for (lVar3 = 0; (ulong)(uint)attributeArraySize * 0xc - lVar3 != 0; lVar3 = lVar3 + 0xc) {
      local_60 = *(undefined4 *)((long)*attributeArray + lVar3 + 8);
      local_68 = *(undefined8 *)((long)*attributeArray + lVar3);
      fVar4 = leb__DotProduct((int)local_58,(float *)&local_68,*y);
      *(float *)((long)*attributeArray + lVar3) = fVar4;
      fVar4 = leb__DotProduct((int)auStack_4c,(float *)&local_68,y_00);
      *(float *)((long)*attributeArray + lVar3 + 4) = fVar4;
      fVar4 = leb__DotProduct((int)&uStack_40,(float *)&local_68,y_01);
      *(float *)((long)*attributeArray + lVar3 + 8) = fVar4;
      y = extraout_RDX_00;
    }
    return;
  }
  __assert_fail("attributeArraySize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0x4c4,"void leb_DecodeNodeAttributeArray(const leb_Node, int, float (*)[3])");
}

Assistant:

LEBDEF void
leb_DecodeNodeAttributeArray(
    const leb_Node node,
    int attributeArraySize,
    float attributeArray[][3]
) {
    LEB_ASSERT(attributeArraySize > 0);

    lebMatrix3x3 m;
    float attributeVector[3];

    leb__DecodeTransformationMatrix(node, m);

    for (int i = 0; i < attributeArraySize; ++i) {
        memcpy(attributeVector, attributeArray[i], sizeof(attributeVector));
        attributeArray[i][0] = leb__DotProduct(3, m[0], attributeVector);
        attributeArray[i][1] = leb__DotProduct(3, m[1], attributeVector);
        attributeArray[i][2] = leb__DotProduct(3, m[2], attributeVector);
    }
}